

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong unaff_R15;
  size_t mask;
  bool bVar32;
  bool bVar33;
  undefined1 auVar36 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar60;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong local_1678;
  undefined1 local_1640 [16];
  ulong local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  Scene *local_1608;
  ulong *local_1600;
  ulong local_15f8;
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [16];
  RTCHitN local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  uint local_1540;
  uint uStack_153c;
  uint uStack_1538;
  uint uStack_1534;
  uint uStack_1530;
  uint uStack_152c;
  uint uStack_1528;
  uint uStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  undefined1 auVar35 [16];
  
  local_1200 = root.ptr;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar70 = ZEXT3264(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar71 = ZEXT3264(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar72 = ZEXT3264(auVar39);
  auVar34 = vmulss_avx512f(auVar37._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar48._0_4_ = auVar34._0_4_;
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar48._16_4_ = auVar48._0_4_;
  auVar48._20_4_ = auVar48._0_4_;
  auVar48._24_4_ = auVar48._0_4_;
  auVar48._28_4_ = auVar48._0_4_;
  auVar34 = vmulss_avx512f(auVar38._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar49._0_4_ = auVar34._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar49._16_4_ = auVar49._0_4_;
  auVar49._20_4_ = auVar49._0_4_;
  auVar49._24_4_ = auVar49._0_4_;
  auVar49._28_4_ = auVar49._0_4_;
  auVar34 = vmulss_avx512f(auVar39._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar39._0_4_ = auVar34._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  local_1610 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1618 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1620 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = local_1610 ^ 0x20;
  uVar27 = local_1618 ^ 0x20;
  uVar29 = local_1620 ^ 0x20;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar73 = ZEXT3264(auVar37);
  auVar38 = vxorps_avx512vl(auVar48,auVar37);
  auVar74 = ZEXT3264(auVar38);
  auVar38 = vxorps_avx512vl(auVar49,auVar37);
  auVar75 = ZEXT3264(auVar38);
  auVar37 = vxorps_avx512vl(auVar39,auVar37);
  auVar76 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar77 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar78 = ZEXT3264(auVar37);
  auVar34 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar79 = ZEXT1664(auVar34);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar80 = ZEXT3264(auVar37);
  auVar34 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar81 = ZEXT1664(auVar34);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar82 = ZEXT3264(auVar37);
  puVar28 = local_11f8;
  do {
    local_1600 = puVar28;
    if (local_1600 == &local_1200) break;
    puVar28 = local_1600 + -1;
    uVar31 = local_1600[-1];
    do {
      if ((uVar31 & 8) == 0) {
        auVar37 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + local_1610),auVar74._0_32_,
                             auVar70._0_32_);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + local_1618),auVar75._0_32_,
                             auVar71._0_32_);
        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + local_1620),auVar76._0_32_,
                             auVar72._0_32_);
        auVar38 = vpmaxsd_avx512vl(auVar38,auVar77._0_32_);
        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + uVar26),auVar74._0_32_,
                             auVar70._0_32_);
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + uVar27),auVar75._0_32_,
                             auVar71._0_32_);
        auVar38 = vpminsd_avx2(auVar38,auVar39);
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar31 + 0x40 + uVar29),auVar76._0_32_,
                             auVar72._0_32_);
        auVar39 = vpminsd_avx512vl(auVar39,auVar78._0_32_);
        auVar38 = vpminsd_avx2(auVar38,auVar39);
        uVar18 = vpcmpd_avx512vl(auVar37,auVar38,2);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar18);
      }
      if ((uVar31 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar60 = 4;
        }
        else {
          uVar30 = uVar31 & 0xfffffffffffffff0;
          lVar25 = 0;
          for (uVar31 = unaff_R15; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          for (uVar23 = unaff_R15 - 1 & unaff_R15; uVar31 = *(ulong *)(uVar30 + lVar25 * 8),
              uVar23 != 0; uVar23 = uVar23 - 1 & uVar23) {
            *puVar28 = uVar31;
            puVar28 = puVar28 + 1;
            lVar25 = 0;
            for (uVar31 = uVar23; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
          }
          uVar60 = 0;
        }
      }
      else {
        uVar60 = 6;
      }
    } while (uVar60 == 0);
    if (uVar60 == 6) {
      uVar60 = 0;
      local_15f8 = (ulong)((uint)uVar31 & 0xf) - 8;
      bVar32 = local_15f8 != 0;
      if (bVar32) {
        uVar31 = uVar31 & 0xfffffffffffffff0;
        uVar30 = 0;
        do {
          lVar24 = uVar30 * 0x60;
          local_1608 = context->scene;
          ppfVar3 = (local_1608->vertices).items;
          pfVar4 = ppfVar3[*(uint *)(uVar31 + 0x48 + lVar24)];
          auVar45._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar31 + 0x28 + lVar24));
          auVar45._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar31 + 8 + lVar24));
          pfVar5 = ppfVar3[*(uint *)(uVar31 + 0x40 + lVar24)];
          auVar52._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + 0x20 + lVar24));
          auVar52._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + lVar24));
          pfVar6 = ppfVar3[*(uint *)(uVar31 + 0x4c + lVar24)];
          auVar58._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar31 + 0x2c + lVar24));
          auVar58._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar31 + 0xc + lVar24));
          pfVar7 = ppfVar3[*(uint *)(uVar31 + 0x44 + lVar24)];
          auVar61._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x24 + lVar24));
          auVar61._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 4 + lVar24));
          lVar25 = uVar31 + 0x40 + lVar24;
          local_1400 = *(undefined8 *)(lVar25 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar25 + 0x18);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          lVar25 = uVar31 + 0x50 + lVar24;
          local_1420 = *(undefined8 *)(lVar25 + 0x10);
          uStack_1418 = *(undefined8 *)(lVar25 + 0x18);
          auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + 0x10 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar31 + 0x18 + lVar24)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + 0x10 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar31 + 0x18 + lVar24)));
          auVar10 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x14 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar31 + 0x1c + lVar24)));
          auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x14 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar31 + 0x1c + lVar24)));
          auVar11 = vunpcklps_avx(auVar34,auVar35);
          auVar12 = vunpcklps_avx(auVar36,auVar10);
          auVar34 = vunpckhps_avx(auVar36,auVar10);
          auVar10 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + 0x30 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar31 + 0x38 + lVar24)));
          auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + 0x30 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar31 + 0x38 + lVar24)));
          auVar13 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x34 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar31 + 0x3c + lVar24)));
          auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x34 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar31 + 0x3c + lVar24)));
          auVar36 = vunpcklps_avx(auVar35,auVar36);
          auVar14 = vunpcklps_avx(auVar10,auVar13);
          auVar35 = vunpckhps_avx(auVar10,auVar13);
          uStack_1410 = local_1420;
          uStack_1408 = uStack_1418;
          auVar37 = vunpcklps_avx(auVar61,auVar58);
          auVar38 = vunpcklps_avx(auVar52,auVar45);
          auVar43 = vunpcklps_avx(auVar38,auVar37);
          auVar44 = vunpckhps_avx(auVar38,auVar37);
          auVar37 = vunpckhps_avx(auVar61,auVar58);
          auVar38 = vunpckhps_avx(auVar52,auVar45);
          auVar45 = vunpcklps_avx(auVar38,auVar37);
          auVar37._16_16_ = auVar12;
          auVar37._0_16_ = auVar12;
          auVar38._16_16_ = auVar34;
          auVar38._0_16_ = auVar34;
          auVar50._16_16_ = auVar11;
          auVar50._0_16_ = auVar11;
          auVar59._16_16_ = auVar14;
          auVar59._0_16_ = auVar14;
          auVar57._16_16_ = auVar35;
          auVar57._0_16_ = auVar35;
          auVar47._16_16_ = auVar36;
          auVar47._0_16_ = auVar36;
          auVar37 = vsubps_avx(auVar43,auVar37);
          auVar38 = vsubps_avx(auVar44,auVar38);
          auVar39 = vsubps_avx(auVar45,auVar50);
          auVar48 = vsubps_avx(auVar59,auVar43);
          auVar49 = vsubps_avx(auVar57,auVar44);
          auVar47 = vsubps_avx(auVar47,auVar45);
          auVar40._4_4_ = auVar38._4_4_ * auVar47._4_4_;
          auVar40._0_4_ = auVar38._0_4_ * auVar47._0_4_;
          auVar40._8_4_ = auVar38._8_4_ * auVar47._8_4_;
          auVar40._12_4_ = auVar38._12_4_ * auVar47._12_4_;
          auVar40._16_4_ = auVar38._16_4_ * auVar47._16_4_;
          auVar40._20_4_ = auVar38._20_4_ * auVar47._20_4_;
          auVar40._24_4_ = auVar38._24_4_ * auVar47._24_4_;
          auVar40._28_4_ = auVar36._12_4_;
          auVar35 = vfmsub231ps_fma(auVar40,auVar49,auVar39);
          auVar41._4_4_ = auVar39._4_4_ * auVar48._4_4_;
          auVar41._0_4_ = auVar39._0_4_ * auVar48._0_4_;
          auVar41._8_4_ = auVar39._8_4_ * auVar48._8_4_;
          auVar41._12_4_ = auVar39._12_4_ * auVar48._12_4_;
          auVar41._16_4_ = auVar39._16_4_ * auVar48._16_4_;
          auVar41._20_4_ = auVar39._20_4_ * auVar48._20_4_;
          auVar41._24_4_ = auVar39._24_4_ * auVar48._24_4_;
          auVar41._28_4_ = auVar11._12_4_;
          auVar36 = vfmsub231ps_fma(auVar41,auVar47,auVar37);
          auVar46._4_4_ = auVar37._4_4_ * auVar49._4_4_;
          auVar46._0_4_ = auVar37._0_4_ * auVar49._0_4_;
          auVar46._8_4_ = auVar37._8_4_ * auVar49._8_4_;
          auVar46._12_4_ = auVar37._12_4_ * auVar49._12_4_;
          auVar46._16_4_ = auVar37._16_4_ * auVar49._16_4_;
          auVar46._20_4_ = auVar37._20_4_ * auVar49._20_4_;
          auVar46._24_4_ = auVar37._24_4_ * auVar49._24_4_;
          auVar46._28_4_ = auVar12._12_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          auVar62._16_4_ = uVar1;
          auVar62._20_4_ = uVar1;
          auVar62._24_4_ = uVar1;
          auVar62._28_4_ = uVar1;
          auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar42._4_4_ = uVar1;
          auVar42._0_4_ = uVar1;
          auVar42._8_4_ = uVar1;
          auVar42._12_4_ = uVar1;
          auVar42._16_4_ = uVar1;
          auVar42._20_4_ = uVar1;
          auVar42._24_4_ = uVar1;
          auVar42._28_4_ = uVar1;
          auVar42 = vsubps_avx512vl(auVar43,auVar42);
          auVar10 = vfmsub231ps_fma(auVar46,auVar48,auVar38);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar43._4_4_ = uVar1;
          auVar43._0_4_ = uVar1;
          auVar43._8_4_ = uVar1;
          auVar43._12_4_ = uVar1;
          auVar43._16_4_ = uVar1;
          auVar43._20_4_ = uVar1;
          auVar43._24_4_ = uVar1;
          auVar43._28_4_ = uVar1;
          auVar43 = vsubps_avx512vl(auVar44,auVar43);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          auVar44._16_4_ = uVar1;
          auVar44._20_4_ = uVar1;
          auVar44._24_4_ = uVar1;
          auVar44._28_4_ = uVar1;
          auVar44 = vsubps_avx512vl(auVar45,auVar44);
          auVar45 = vmulps_avx512vl(auVar40,auVar44);
          auVar45 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
          auVar46 = vmulps_avx512vl(auVar41,auVar42);
          auVar11 = vfmsub231ps_fma(auVar46,auVar44,auVar62);
          auVar46 = vmulps_avx512vl(auVar62,auVar43);
          auVar46 = vfmsub231ps_avx512vl(auVar46,auVar42,auVar40);
          auVar41 = vmulps_avx512vl(ZEXT1632(auVar10),auVar41);
          auVar40 = vfmadd231ps_avx512vl(auVar41,ZEXT1632(auVar36),auVar40);
          local_1380 = vfmadd231ps_avx512vl(auVar40,ZEXT1632(auVar35),auVar62);
          vandps_avx512vl(local_1380,auVar80._0_32_);
          vandps_avx512vl(local_1380,auVar73._0_32_);
          auVar47 = vmulps_avx512vl(auVar47,auVar46);
          auVar34 = vfmadd231ps_fma(auVar47,ZEXT1632(auVar11),auVar49);
          auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar45,auVar48);
          uVar60 = local_1380._0_4_;
          local_13e0._0_4_ = (float)(uVar60 ^ auVar34._0_4_);
          uVar63 = local_1380._4_4_;
          local_13e0._4_4_ = (float)(uVar63 ^ auVar34._4_4_);
          uVar64 = local_1380._8_4_;
          local_13e0._8_4_ = (float)(uVar64 ^ auVar34._8_4_);
          uVar65 = local_1380._12_4_;
          local_13e0._12_4_ = (float)(uVar65 ^ auVar34._12_4_);
          fVar66 = local_1380._16_4_;
          local_13e0._16_4_ = fVar66;
          fVar67 = local_1380._20_4_;
          local_13e0._20_4_ = fVar67;
          fVar68 = local_1380._24_4_;
          local_13e0._24_4_ = fVar68;
          fStack_1284 = local_1380._28_4_;
          local_13e0._28_4_ = fStack_1284;
          auVar39 = vmulps_avx512vl(auVar39,auVar46);
          auVar34 = vfmadd231ps_fma(auVar39,auVar38,ZEXT1632(auVar11));
          auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar37,auVar45);
          local_13c0._0_4_ = (float)(uVar60 ^ auVar34._0_4_);
          local_13c0._4_4_ = (float)(uVar63 ^ auVar34._4_4_);
          local_13c0._8_4_ = (float)(uVar64 ^ auVar34._8_4_);
          local_13c0._12_4_ = (float)(uVar65 ^ auVar34._12_4_);
          local_13c0._16_4_ = fVar66;
          local_13c0._20_4_ = fVar67;
          local_13c0._24_4_ = fVar68;
          local_13c0._28_4_ = fStack_1284;
          auVar37 = auVar81._0_32_;
          uVar18 = vcmpps_avx512vl(local_13e0,auVar37,5);
          uVar15 = vcmpps_avx512vl(local_13c0,auVar37,5);
          uVar16 = vcmpps_avx512vl(local_1380,auVar37,4);
          auVar69._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
          auVar69._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
          auVar69._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
          auVar69._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
          auVar69._16_4_ = fVar66 + fVar66;
          auVar69._20_4_ = fVar67 + fVar67;
          auVar69._24_4_ = fVar68 + fVar68;
          auVar69._28_4_ = fStack_1284 + fStack_1284;
          uVar17 = vcmpps_avx512vl(auVar69,local_1380,2);
          local_1300 = (byte)uVar18 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
          if (local_1300 != 0) {
            auVar21._4_4_ = auVar44._4_4_ * auVar10._4_4_;
            auVar21._0_4_ = auVar44._0_4_ * auVar10._0_4_;
            auVar21._8_4_ = auVar44._8_4_ * auVar10._8_4_;
            auVar21._12_4_ = auVar44._12_4_ * auVar10._12_4_;
            auVar21._16_4_ = auVar44._16_4_ * 0.0;
            auVar21._20_4_ = auVar44._20_4_ * 0.0;
            auVar21._24_4_ = auVar44._24_4_ * 0.0;
            auVar21._28_4_ = auVar44._28_4_;
            auVar34 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar36),auVar21);
            auVar34 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar35),ZEXT1632(auVar34));
            local_13a0._0_4_ = (float)(uVar60 ^ auVar34._0_4_);
            local_13a0._4_4_ = (float)(uVar63 ^ auVar34._4_4_);
            local_13a0._8_4_ = (float)(uVar64 ^ auVar34._8_4_);
            local_13a0._12_4_ = (float)(uVar65 ^ auVar34._12_4_);
            local_13a0._16_4_ = fVar66;
            local_13a0._20_4_ = fVar67;
            local_13a0._24_4_ = fVar68;
            local_13a0._28_4_ = fStack_1284;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar19._4_4_ = uVar1;
            auVar19._0_4_ = uVar1;
            auVar19._8_4_ = uVar1;
            auVar19._12_4_ = uVar1;
            auVar19._16_4_ = uVar1;
            auVar19._20_4_ = uVar1;
            auVar19._24_4_ = uVar1;
            auVar19._28_4_ = uVar1;
            auVar37 = vmulps_avx512vl(local_1380,auVar19);
            uVar18 = vcmpps_avx512vl(auVar37,local_13a0,1);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar20._4_4_ = uVar1;
            auVar20._0_4_ = uVar1;
            auVar20._8_4_ = uVar1;
            auVar20._12_4_ = uVar1;
            auVar20._16_4_ = uVar1;
            auVar20._20_4_ = uVar1;
            auVar20._24_4_ = uVar1;
            auVar20._28_4_ = uVar1;
            auVar37 = vmulps_avx512vl(local_1380,auVar20);
            uVar15 = vcmpps_avx512vl(local_13a0,auVar37,2);
            local_1300 = (byte)uVar18 & (byte)uVar15 & local_1300;
            if (local_1300 != 0) {
              local_1360 = ZEXT1632(auVar35);
              local_1340 = ZEXT1632(auVar36);
              local_1320 = ZEXT1632(auVar10);
              local_1220 = 0xf0;
              auVar37 = vrcp14ps_avx512vl(local_1380);
              auVar48 = auVar82._0_32_;
              auVar38 = vfnmadd213ps_avx512vl(local_1380,auVar37,auVar48);
              auVar34 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
              fVar51 = auVar34._0_4_;
              fVar54 = auVar34._4_4_;
              fVar55 = auVar34._8_4_;
              fVar56 = auVar34._12_4_;
              local_12a0[0] = fVar51 * local_13a0._0_4_;
              local_12a0[1] = fVar54 * local_13a0._4_4_;
              local_12a0[2] = fVar55 * local_13a0._8_4_;
              local_12a0[3] = fVar56 * local_13a0._12_4_;
              fStack_1290 = fVar66 * 0.0;
              fStack_128c = fVar67 * 0.0;
              fStack_1288 = fVar68 * 0.0;
              auVar22._4_4_ = fVar54 * local_13e0._4_4_;
              auVar22._0_4_ = fVar51 * local_13e0._0_4_;
              auVar22._8_4_ = fVar55 * local_13e0._8_4_;
              auVar22._12_4_ = fVar56 * local_13e0._12_4_;
              auVar22._16_4_ = fVar66 * 0.0;
              auVar22._20_4_ = fVar67 * 0.0;
              auVar22._24_4_ = fVar68 * 0.0;
              auVar22._28_4_ = fStack_1284;
              auVar37 = vminps_avx512vl(auVar22,auVar48);
              auVar53._0_4_ = fVar51 * local_13c0._0_4_;
              auVar53._4_4_ = fVar54 * local_13c0._4_4_;
              auVar53._8_4_ = fVar55 * local_13c0._8_4_;
              auVar53._12_4_ = fVar56 * local_13c0._12_4_;
              auVar53._16_4_ = fVar66 * 0.0;
              auVar53._20_4_ = fVar67 * 0.0;
              auVar53._24_4_ = fVar68 * 0.0;
              auVar53._28_4_ = 0;
              auVar38 = vminps_avx512vl(auVar53,auVar48);
              auVar39 = vsubps_avx512vl(auVar48,auVar37);
              auVar48 = vsubps_avx512vl(auVar48,auVar38);
              local_12c0 = vblendps_avx(auVar38,auVar39,0xf0);
              local_12e0 = vblendps_avx(auVar37,auVar48,0xf0);
              fVar66 = (float)DAT_02060940;
              local_1280._0_4_ = auVar35._0_4_ * fVar66;
              fVar67 = DAT_02060940._4_4_;
              local_1280._4_4_ = auVar35._4_4_ * fVar67;
              fVar68 = DAT_02060940._8_4_;
              local_1280._8_4_ = auVar35._8_4_ * fVar68;
              fVar51 = DAT_02060940._12_4_;
              local_1280._12_4_ = auVar35._12_4_ * fVar51;
              fVar54 = DAT_02060940._16_4_;
              local_1280._16_4_ = fVar54 * 0.0;
              fVar55 = DAT_02060940._20_4_;
              local_1280._20_4_ = fVar55 * 0.0;
              fVar56 = DAT_02060940._24_4_;
              local_1280._24_4_ = fVar56 * 0.0;
              local_1280._28_4_ = 0;
              local_1260._0_4_ = auVar36._0_4_ * fVar66;
              local_1260._4_4_ = auVar36._4_4_ * fVar67;
              local_1260._8_4_ = auVar36._8_4_ * fVar68;
              local_1260._12_4_ = auVar36._12_4_ * fVar51;
              local_1260._16_4_ = fVar54 * 0.0;
              local_1260._20_4_ = fVar55 * 0.0;
              local_1260._24_4_ = fVar56 * 0.0;
              local_1260._28_4_ = 0;
              local_1240._4_4_ = auVar10._4_4_ * fVar67;
              local_1240._0_4_ = auVar10._0_4_ * fVar66;
              local_1240._8_4_ = auVar10._8_4_ * fVar68;
              local_1240._12_4_ = auVar10._12_4_ * fVar51;
              local_1240._16_4_ = fVar54 * 0.0;
              local_1240._20_4_ = fVar55 * 0.0;
              local_1240._24_4_ = fVar56 * 0.0;
              local_1240._28_4_ = 0;
              local_1678 = (ulong)local_1300;
              do {
                auVar34 = auVar81._0_16_;
                local_1628 = 0;
                for (uVar23 = local_1678; (uVar23 & 1) == 0;
                    uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                  local_1628 = local_1628 + 1;
                }
                pGVar8 = (local_1608->geometries).items
                         [*(uint *)((long)&local_1400 + local_1628 * 4)].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_1678 = local_1678 ^ 1L << (local_1628 & 0x3f);
                  bVar33 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar33 = false;
                }
                else {
                  local_1520 = vmovdqa64_avx512vl(auVar78._0_32_);
                  local_1500 = vmovdqa64_avx512vl(auVar77._0_32_);
                  local_14e0 = auVar76._0_32_;
                  local_14c0 = auVar75._0_32_;
                  local_14a0 = auVar74._0_32_;
                  local_1480 = auVar72._0_32_;
                  local_1460 = auVar71._0_32_;
                  local_1440 = auVar70._0_32_;
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar23 = (ulong)(uint)((int)local_1628 * 4);
                  uVar2 = *(undefined4 *)(local_12e0 + uVar23);
                  local_1580._4_4_ = uVar2;
                  local_1580._0_4_ = uVar2;
                  local_1580._8_4_ = uVar2;
                  local_1580._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_12c0 + uVar23);
                  local_1570._4_4_ = uVar2;
                  local_1570._0_4_ = uVar2;
                  local_1570._8_4_ = uVar2;
                  local_1570._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar23);
                  local_15f0.context = context->user;
                  local_1550 = vpbroadcastd_avx512vl();
                  uVar2 = *(undefined4 *)((long)&local_1420 + uVar23);
                  local_1560._4_4_ = uVar2;
                  local_1560._0_4_ = uVar2;
                  local_1560._8_4_ = uVar2;
                  local_1560._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1280 + uVar23);
                  local_15b0._4_4_ = uVar2;
                  local_15b0._0_4_ = uVar2;
                  local_15b0._8_4_ = uVar2;
                  local_15b0._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1260 + uVar23);
                  local_15a0._4_4_ = uVar2;
                  local_15a0._0_4_ = uVar2;
                  local_15a0._8_4_ = uVar2;
                  local_15a0._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1240 + uVar23);
                  local_1590._4_4_ = uVar2;
                  local_1590._0_4_ = uVar2;
                  local_1590._8_4_ = uVar2;
                  local_1590._12_4_ = uVar2;
                  vpcmpeqd_avx2(ZEXT1632(local_1550),ZEXT1632(local_1550));
                  uStack_153c = (local_15f0.context)->instID[0];
                  local_1540 = uStack_153c;
                  uStack_1538 = uStack_153c;
                  uStack_1534 = uStack_153c;
                  uStack_1530 = (local_15f0.context)->instPrimID[0];
                  uStack_152c = uStack_1530;
                  uStack_1528 = uStack_1530;
                  uStack_1524 = uStack_1530;
                  local_15c0 = vmovdqa64_avx512vl(auVar79._0_16_);
                  local_1640 = vmovdqa64_avx512vl(auVar79._0_16_);
                  local_15f0.valid = (int *)local_1640;
                  local_15f0.geometryUserPtr = pGVar8->userPtr;
                  local_15f0.hit = local_15b0;
                  local_15f0.N = 4;
                  local_15f0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_15f0);
                  }
                  uVar23 = vptestmd_avx512vl(local_1640,local_1640);
                  if ((uVar23 & 0xf) == 0) {
                    bVar33 = true;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_15f0);
                    }
                    uVar23 = vptestmd_avx512vl(local_1640,local_1640);
                    uVar23 = uVar23 & 0xf;
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar33 = (bool)((byte)uVar23 & 1);
                    auVar36._0_4_ =
                         (uint)bVar33 * auVar35._0_4_ |
                         (uint)!bVar33 * *(int *)(local_15f0.ray + 0x80);
                    bVar33 = (bool)((byte)(uVar23 >> 1) & 1);
                    auVar36._4_4_ =
                         (uint)bVar33 * auVar35._4_4_ |
                         (uint)!bVar33 * *(int *)(local_15f0.ray + 0x84);
                    bVar33 = (bool)((byte)(uVar23 >> 2) & 1);
                    auVar36._8_4_ =
                         (uint)bVar33 * auVar35._8_4_ |
                         (uint)!bVar33 * *(int *)(local_15f0.ray + 0x88);
                    bVar33 = SUB81(uVar23 >> 3,0);
                    auVar36._12_4_ =
                         (uint)bVar33 * auVar35._12_4_ |
                         (uint)!bVar33 * *(int *)(local_15f0.ray + 0x8c);
                    *(undefined1 (*) [16])(local_15f0.ray + 0x80) = auVar36;
                    bVar33 = (byte)uVar23 == 0;
                  }
                  if (bVar33) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                    local_1678 = local_1678 ^ 1L << (local_1628 & 0x3f);
                  }
                  auVar70 = ZEXT3264(local_1440);
                  auVar71 = ZEXT3264(local_1460);
                  auVar72 = ZEXT3264(local_1480);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar73 = ZEXT3264(auVar37);
                  auVar74 = ZEXT3264(local_14a0);
                  auVar75 = ZEXT3264(local_14c0);
                  auVar76 = ZEXT3264(local_14e0);
                  auVar37 = vmovdqa64_avx512vl(local_1500);
                  auVar77 = ZEXT3264(auVar37);
                  auVar37 = vmovdqa64_avx512vl(local_1520);
                  auVar78 = ZEXT3264(auVar37);
                  auVar35 = vmovdqa64_avx512vl(local_15c0);
                  auVar79 = ZEXT1664(auVar35);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar80 = ZEXT3264(auVar37);
                  auVar34 = vxorps_avx512vl(auVar34,auVar34);
                  auVar81 = ZEXT1664(auVar34);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar82 = ZEXT3264(auVar37);
                }
                if (!bVar33) {
                  uVar60 = 0;
                  if (bVar32) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar60 = 1;
                  }
                  goto LAB_0084fc7d;
                }
              } while (local_1678 != 0);
            }
          }
          uVar30 = uVar30 + 1;
          bVar32 = uVar30 < local_15f8;
        } while (uVar30 != local_15f8);
        uVar60 = 0;
      }
    }
LAB_0084fc7d:
  } while ((uVar60 & 3) == 0);
  return local_1600 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }